

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O0

void __thiscall duckdb::LineReader::FillBuffer(LineReader *this)

{
  size_t sVar1;
  long *in_RDI;
  size_t read_data;
  
  if (((*(byte *)((long)in_RDI + 0x96012) & 1) == 0) && (*in_RDI != 0)) {
    sVar1 = fread((void *)((long)in_RDI + 0x32011),1,0x64000,(FILE *)*in_RDI);
    in_RDI[0x12c03] = 0;
    in_RDI[0x12c04] = sVar1;
    in_RDI[0x12c05] = sVar1 + in_RDI[0x12c05];
    *(undefined1 *)((long)in_RDI + sVar1 + 0x32011) = 0;
    if (sVar1 == 0) {
      *(undefined1 *)((long)in_RDI + 0x96012) = 1;
    }
    if (0x63fffff < (ulong)in_RDI[0x12c05]) {
      fprintf(_stderr,
              "History file \"%s\" exceeds maximum history file size of %d MB - skipping full load\n"
              ,in_RDI[1],100);
      in_RDI[0x12c04] = 0;
      *(undefined1 *)((long)in_RDI + 0x96012) = 1;
    }
  }
  return;
}

Assistant:

void FillBuffer() {
		if (end_of_file || !fp) {
			return;
		}
		size_t read_data = fread(data_buffer, 1, LINE_BUFFER_SIZE, fp);
		position = 0;
		capacity = read_data;
		total_read += read_data;
		data_buffer[read_data] = '\0';

		if (read_data == 0) {
			end_of_file = true;
		}
		if (total_read >= LINENOISE_MAX_HISTORY) {
			fprintf(stderr, "History file \"%s\" exceeds maximum history file size of %d MB - skipping full load\n",
			        filename, LINENOISE_MAX_HISTORY / 1024 / 1024);
			capacity = 0;
			end_of_file = true;
		}
	}